

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fMultisampleTests.cpp
# Opt level: O2

void __thiscall deqp::gles2::Functional::SampleDepthCase::renderPattern(SampleDepthCase *this)

{
  GLenum GVar1;
  int i;
  uint uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vec4 color;
  Vec4 local_70;
  Vec3 local_60;
  Vec3 local_50;
  Vec3 local_40;
  
  glwClearColor(0.0,0.0,0.0,0.0);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glClearColor(0.0f, 0.0f, 0.0f, 0.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x396);
  glwClearDepthf(1.0);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glClearDepthf(1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x397);
  glwClear(0x4100);
  GVar1 = glwGetError();
  glu::checkError(GVar1,"glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fMultisampleTests.cpp"
                  ,0x398);
  for (uVar2 = 0; uVar2 != 0x32; uVar2 = uVar2 + 1) {
    local_70.m_data[0] = 1.0;
    if ((uVar2 & 1) != 0) {
      local_70.m_data[0] = 0.0;
    }
    local_70.m_data[3] = 1.0;
    fVar5 = (float)(this->super_NumSamplesCase).m_currentIteration * 0.001 +
            ((float)(int)uVar2 * 6.2831855) / 50.0;
    local_70.m_data[1] = local_70.m_data[0];
    local_70.m_data[2] = local_70.m_data[0];
    fVar3 = cosf(fVar5 + 0.0);
    fVar4 = sinf(fVar5 + 0.0);
    local_40.m_data[1] = fVar4 * 3.0;
    local_40.m_data[0] = fVar3 * 3.0;
    local_40.m_data[2] = 1.0;
    fVar3 = cosf(fVar5 + 2.0943952);
    fVar4 = sinf(fVar5 + 2.0943952);
    local_50.m_data[1] = fVar4 * 3.0;
    local_50.m_data[0] = fVar3 * 3.0;
    local_50.m_data[2] = 0.0;
    fVar3 = cosf(fVar5 + 4.1887903);
    fVar4 = sinf(fVar5 + 4.1887903);
    local_60.m_data[1] = fVar4 * 3.0;
    local_60.m_data[0] = fVar3 * 3.0;
    local_60.m_data[2] = 0.0;
    MultisampleCase::renderTriangle((MultisampleCase *)this,&local_40,&local_50,&local_60,&local_70)
    ;
  }
  return;
}

Assistant:

void SampleDepthCase::renderPattern (void) const
{
	GLU_CHECK_CALL(glClearColor(0.0f, 0.0f, 0.0f, 0.0f));
	GLU_CHECK_CALL(glClearDepthf(1.0f));
	GLU_CHECK_CALL(glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT));

	{
		const int numPolygons = 50;

		for (int i = 0; i < numPolygons; i++)
		{
			Vec4	color	= i % 2 == 0 ? Vec4(1.0f, 1.0f, 1.0f, 1.0f) : Vec4(0.0f, 0.0f, 0.0f, 1.0f);
			float	angle	= 2.0f * DE_PI * (float)i / (float)numPolygons + 0.001f*(float)m_currentIteration;
			Vec3	pt0		(3.0f*deFloatCos(angle + 2.0f*DE_PI*0.0f/3.0f), 3.0f*deFloatSin(angle + 2.0f*DE_PI*0.0f/3.0f), 1.0f);
			Vec3	pt1		(3.0f*deFloatCos(angle + 2.0f*DE_PI*1.0f/3.0f), 3.0f*deFloatSin(angle + 2.0f*DE_PI*1.0f/3.0f), 0.0f);
			Vec3	pt2		(3.0f*deFloatCos(angle + 2.0f*DE_PI*2.0f/3.0f), 3.0f*deFloatSin(angle + 2.0f*DE_PI*2.0f/3.0f), 0.0f);

			renderTriangle(pt0, pt1, pt2, color);
		}
	}
}